

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::MergeSubNegateArithmetic::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this_00;
  Instruction *context_00;
  Op OVar1;
  uint32_t id;
  TypeManager *this_01;
  const_reference ppCVar2;
  bool bVar3;
  Operand *local_188;
  allocator<spvtools::opt::Operand> local_16d;
  uint32_t local_16c;
  iterator local_168;
  undefined8 local_160;
  SmallVector<unsigned_int,_2UL> local_158;
  Op local_12c;
  Op *local_128;
  undefined8 local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  Operand local_f0;
  Operand OStack_c0;
  iterator local_90;
  _func_int **local_88;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_80;
  Op local_64;
  uint32_t local_60;
  Op opcode;
  uint32_t op2;
  uint32_t op1;
  Instruction *other_inst;
  Constant *const_input1;
  uint32_t width;
  bool uses_float;
  Type *type;
  ConstantManager *const_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  const_mgr = (ConstantManager *)constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  context_local = (IRContext *)this;
  OVar1 = Instruction::opcode(inst);
  bVar3 = true;
  if (OVar1 != OpFSub) {
    OVar1 = Instruction::opcode((Instruction *)constants_local);
    bVar3 = OVar1 == OpISub;
  }
  if (bVar3) {
    type = (Type *)IRContext::get_constant_mgr((IRContext *)inst_local);
    this_01 = IRContext::get_type_mgr((IRContext *)inst_local);
    id = Instruction::type_id((Instruction *)constants_local);
    _width = analysis::TypeManager::GetType(this_01,id);
    bVar3 = IsCooperativeMatrix(_width);
    if (bVar3) {
      this_local._7_1_ = false;
    }
    else {
      const_input1._7_1_ = HasFloatingPoint(_width);
      if ((!(bool)const_input1._7_1_) ||
         (bVar3 = Instruction::IsFloatingPointFoldingAllowed((Instruction *)constants_local), bVar3)
         ) {
        const_input1._0_4_ = ElementWidth(_width);
        if (((uint32_t)const_input1 == 0x20) || ((uint32_t)const_input1 == 0x40)) {
          other_inst = (Instruction *)
                       ConstInput((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                   *)const_mgr);
          context_00 = inst_local;
          if (other_inst == (Instruction *)0x0) {
            this_local._7_1_ = false;
          }
          else {
            ppCVar2 = std::
                      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                    *)const_mgr,0);
            _op2 = NonConstInput((IRContext *)context_00,*ppCVar2,(Instruction *)constants_local);
            if (((const_input1._7_1_ & 1) == 0) ||
               (bVar3 = Instruction::IsFloatingPointFoldingAllowed(_op2), bVar3)) {
              OVar1 = Instruction::opcode(_op2);
              if ((OVar1 == OpSNegate) || (OVar1 = Instruction::opcode(_op2), OVar1 == OpFNegate)) {
                opcode = OpNop;
                local_60 = 0;
                local_64 = Instruction::opcode((Instruction *)constants_local);
                ppCVar2 = std::
                          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                        *)const_mgr,0);
                if (*ppCVar2 == (value_type)0x0) {
                  opcode = NegateConstant((ConstantManager *)type,(Constant *)other_inst);
                  local_60 = Instruction::GetSingleWordInOperand(_op2,0);
                }
                else {
                  opcode = Instruction::GetSingleWordInOperand(_op2,0);
                  local_60 = Instruction::GetSingleWordInOperand((Instruction *)constants_local,0);
                  bVar3 = HasFloatingPoint(_width);
                  local_64 = OpIAdd;
                  if (bVar3) {
                    local_64 = OpFAdd;
                  }
                }
                Instruction::SetOpcode((Instruction *)constants_local,local_64);
                this_00 = constants_local;
                local_12c = opcode;
                local_128 = &local_12c;
                local_120 = 1;
                init_list_00._M_len = 1;
                init_list_00._M_array = local_128;
                utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list_00);
                Operand::Operand(&local_f0,SPV_OPERAND_TYPE_ID,&local_118);
                local_16c = local_60;
                local_168 = &local_16c;
                local_160 = 1;
                init_list._M_len = 1;
                init_list._M_array = local_168;
                utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list);
                Operand::Operand(&OStack_c0,SPV_OPERAND_TYPE_ID,&local_158);
                local_90 = &local_f0;
                local_88 = (_func_int **)0x2;
                std::allocator<spvtools::opt::Operand>::allocator(&local_16d);
                __l._M_len = (size_type)local_88;
                __l._M_array = local_90;
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                          (&local_80,__l,&local_16d);
                Instruction::SetInOperands((Instruction *)this_00,&local_80);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                ~vector(&local_80);
                std::allocator<spvtools::opt::Operand>::~allocator(&local_16d);
                local_188 = (Operand *)&local_90;
                do {
                  local_188 = local_188 + -1;
                  Operand::~Operand(local_188);
                } while (local_188 != &local_f0);
                utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
                utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpFSub || inst->opcode() == spv::Op::OpISub",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0x459,
                "auto spvtools::opt::(anonymous namespace)::MergeSubNegateArithmetic()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule MergeSubNegateArithmetic() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpFSub ||
           inst->opcode() == spv::Op::OpISub);
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    const analysis::Type* type =
        context->get_type_mgr()->GetType(inst->type_id());

    if (IsCooperativeMatrix(type)) {
      return false;
    }

    bool uses_float = HasFloatingPoint(type);
    if (uses_float && !inst->IsFloatingPointFoldingAllowed()) return false;

    uint32_t width = ElementWidth(type);
    if (width != 32 && width != 64) return false;

    const analysis::Constant* const_input1 = ConstInput(constants);
    if (!const_input1) return false;
    Instruction* other_inst = NonConstInput(context, constants[0], inst);
    if (uses_float && !other_inst->IsFloatingPointFoldingAllowed())
      return false;

    if (other_inst->opcode() == spv::Op::OpSNegate ||
        other_inst->opcode() == spv::Op::OpFNegate) {
      uint32_t op1 = 0;
      uint32_t op2 = 0;
      spv::Op opcode = inst->opcode();
      if (constants[0] != nullptr) {
        op1 = other_inst->GetSingleWordInOperand(0u);
        op2 = inst->GetSingleWordInOperand(0u);
        opcode = HasFloatingPoint(type) ? spv::Op::OpFAdd : spv::Op::OpIAdd;
      } else {
        op1 = NegateConstant(const_mgr, const_input1);
        op2 = other_inst->GetSingleWordInOperand(0u);
      }

      inst->SetOpcode(opcode);
      inst->SetInOperands(
          {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}});
      return true;
    }
    return false;
  };
}